

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  uint in_EDX;
  Byte *in_RSI;
  undefined8 *in_RDI;
  int __result___1;
  int __result__;
  CLzmaProps propNew;
  ISzAlloc *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  CLzmaDec *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  SRes local_4;
  
  local_4 = LzmaProps_Decode((CLzmaProps *)&stack0xffffffffffffffc8,in_RSI,in_EDX);
  if ((local_4 == 0) &&
     (local_4 = LzmaDec_AllocateProbs2
                          (in_stack_ffffffffffffffc8,(CLzmaProps *)(ulong)in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8), local_4 == 0)) {
    *in_RDI = in_stack_ffffffffffffffc8;
    in_RDI[1] = local_30;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}